

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedVecs(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  undefined8 *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if ((pSVar2->theType == ENTER) &&
     (uVar9 = (uint)((ulong)((long)(pSVar2->weights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSVar2->weights).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 7), 0 < (int)uVar9))
  {
    lVar10 = 0x1e;
    uVar6 = 0;
    do {
      lVar11 = (long)perm[uVar6];
      if (-1 < lVar11) {
        pnVar3 = (pSVar2->weights).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar10 * 4);
        puVar7 = (uint *)(puVar1 + -0xf);
        puVar8 = (uint *)(pnVar3 + lVar11);
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + 1;
          puVar8 = puVar8 + 1;
        }
        pnVar3[lVar11].m_backend.exp = *(int *)(puVar1 + -1);
        pnVar3[lVar11].m_backend.neg = *(bool *)((long)puVar1 + -4);
        uVar4 = *puVar1;
        pnVar3[lVar11].m_backend.fpclass = (int)uVar4;
        pnVar3[lVar11].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
      }
      uVar6 = uVar6 + 1;
      lVar10 = lVar10 + 0x20;
    } while ((uVar9 & 0x7fffffff) != uVar6);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&pSVar2->weights,
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->thevectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;
      int j = weights.dim();

      for(i = 0; i < j; ++i)
      {
         if(perm[i] >= 0)
            weights[perm[i]] = weights[i];
      }
   }

   weights.reDim(this->thesolver->coDim());
}